

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O0

typed_value<std::vector<int,_std::allocator<int>_>,_char> * __thiscall
VW::config::options_boost_po::get_base_boost_value<int>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<int>_> *opt)

{
  initializer_list<int> __l;
  bool bVar1;
  int iVar2;
  undefined8 this_00;
  typed_value<std::vector<int,_std::allocator<int>_>,_char> *ptVar3;
  options_boost_po *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  typed_value<std::vector<int,_std::allocator<int>_>,_char> *value;
  undefined4 in_stack_ffffffffffffffb8;
  iterator piVar4;
  size_type in_stack_ffffffffffffffd0;
  typed_value<std::vector<int,_std::allocator<int>_>,_char> *in_stack_ffffffffffffffe0;
  undefined8 uVar5;
  
  this_00 = boost::program_options::value<std::vector<int,std::allocator<int>>>();
  std::__shared_ptr_access<VW::config::typed_option<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<VW::config::typed_option<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x339b6c);
  bVar1 = typed_option<int>::default_value_supplied((typed_option<int> *)0x339b74);
  if (bVar1) {
    uVar5 = this_00;
    std::
    __shared_ptr_access<VW::config::typed_option<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<VW::config::typed_option<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x339b91);
    iVar2 = typed_option<int>::default_value((typed_option<int> *)this_00);
    ptVar3 = (typed_value<std::vector<int,_std::allocator<int>_>,_char> *)&stack0xffffffffffffffbc;
    piVar4 = (iterator)0x1;
    std::allocator<int>::allocator((allocator<int> *)0x339bbf);
    __l._M_len = in_stack_ffffffffffffffd0;
    __l._M_array = piVar4;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)ptVar3,__l,
               (allocator_type *)CONCAT44(iVar2,in_stack_ffffffffffffffb8));
    boost::program_options::typed_value<std::vector<int,_std::allocator<int>_>,_char>::default_value
              (ptVar3,(vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,in_stack_ffffffffffffffb8)
              );
    std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
    std::allocator<int>::~allocator((allocator<int> *)0x339bff);
    this_00 = uVar5;
  }
  ptVar3 = add_notifier<int>(in_RSI,(shared_ptr<VW::config::typed_option<int>_> *)this_00,
                             in_stack_ffffffffffffffe0);
  ptVar3 = boost::program_options::typed_value<std::vector<int,_std::allocator<int>_>,_char>::
           composing(ptVar3);
  return ptVar3;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::get_base_boost_value(std::shared_ptr<typed_option<T>>& opt)
{
  auto value = po::value<std::vector<T>>();

  if (opt->default_value_supplied())
  {
    value->default_value({opt->default_value()});
  }

  return add_notifier(opt, value)->composing();
}